

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

void GPU_GetDefaultRendererOrder(int *order_size,GPU_RendererID *order)

{
  long lVar1;
  GPU_RendererID *pGVar2;
  byte bVar3;
  GPU_RendererID local_140;
  GPU_RendererID default_order [10];
  
  bVar3 = 0;
  GPU_MakeRendererID(default_order,"OpenGL 4",5,4,0);
  GPU_MakeRendererID(&local_140,"OpenGL 3",4,3,0);
  default_order[1].minor_version = local_140.minor_version;
  default_order[1]._20_4_ = local_140._20_4_;
  default_order[1].name = local_140.name;
  default_order[1].renderer = local_140.renderer;
  default_order[1].major_version = local_140.major_version;
  GPU_MakeRendererID(&local_140,"OpenGL 2",3,2,0);
  default_order[2].minor_version = local_140.minor_version;
  default_order[2]._20_4_ = local_140._20_4_;
  default_order[2].name = local_140.name;
  default_order[2].renderer = local_140.renderer;
  default_order[2].major_version = local_140.major_version;
  GPU_MakeRendererID(&local_140,"OpenGL 1",2,1,1);
  default_order[3].minor_version = local_140.minor_version;
  default_order[3]._20_4_ = local_140._20_4_;
  default_order[3].name = local_140.name;
  default_order[3].renderer = local_140.renderer;
  default_order[3].major_version = local_140.major_version;
  if (order_size != (int *)0x0) {
    *order_size = 4;
  }
  if (order != (GPU_RendererID *)0x0) {
    pGVar2 = default_order;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      order->name = pGVar2->name;
      pGVar2 = (GPU_RendererID *)((long)pGVar2 + (ulong)bVar3 * -0x10 + 8);
      order = (GPU_RendererID *)((long)order + (ulong)bVar3 * -0x10 + 8);
    }
  }
  return;
}

Assistant:

void GPU_GetDefaultRendererOrder(int* order_size, GPU_RendererID* order)
{
    int count = 0;
    GPU_RendererID default_order[GPU_RENDERER_ORDER_MAX];
    
    #ifndef SDL_GPU_DISABLE_GLES
        #ifndef SDL_GPU_DISABLE_GLES_3
            default_order[count++] = GPU_MakeRendererID("OpenGLES 3", GPU_RENDERER_GLES_3, 3, 0);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_2
            default_order[count++] = GPU_MakeRendererID("OpenGLES 2", GPU_RENDERER_GLES_2, 2, 0);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_1
            default_order[count++] = GPU_MakeRendererID("OpenGLES 1", GPU_RENDERER_GLES_1, 1, 1);
        #endif
    #endif
    
    #ifndef SDL_GPU_DISABLE_OPENGL
        #ifdef __MACOSX__
        
            // My understanding of OS X OpenGL support:
            // OS X 10.9: GL 2.1, 3.3, 4.1
            // OS X 10.7: GL 2.1, 3.2
            // OS X 10.6: GL 1.4, 2.1
            #ifndef SDL_GPU_DISABLE_OPENGL_4
            default_order[count++] = GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 1);
            #endif
            #ifndef SDL_GPU_DISABLE_OPENGL_3
            default_order[count++] = GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 2);
            #endif
        
        #else
        
            #ifndef SDL_GPU_DISABLE_OPENGL_4
            default_order[count++] = GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 0);
            #endif
            #ifndef SDL_GPU_DISABLE_OPENGL_3
            default_order[count++] = GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 0);
            #endif
            
        #endif
        
        #ifndef SDL_GPU_DISABLE_OPENGL_2
        default_order[count++] = GPU_MakeRendererID("OpenGL 2", GPU_RENDERER_OPENGL_2, 2, 0);
        #endif
        #ifndef SDL_GPU_DISABLE_OPENGL_1
        default_order[count++] = GPU_MakeRendererID("OpenGL 1", GPU_RENDERER_OPENGL_1, 1, 1);
        #endif
        
    #endif
    
    if(order_size != NULL)
        *order_size = count;
    
    if(order != NULL && count > 0)
        memcpy(order, default_order, count*sizeof(GPU_RendererID));
}